

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

int PAL_wcsncmp(char16_t *string1,char16_t *string2,size_t count)

{
  char16_t *pcVar1;
  int iVar2;
  size_t sVar3;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (string1 != string2) {
    sVar3 = 0;
    do {
      if (count == sVar3) {
        return 0;
      }
      pcVar1 = string1 + sVar3;
      iVar2 = (uint)(ushort)*pcVar1 - (uint)(ushort)string2[sVar3];
      if (iVar2 != 0) {
        return iVar2;
      }
      sVar3 = sVar3 + 1;
    } while (*pcVar1 != L'\0');
  }
  return 0;
}

Assistant:

int
__cdecl
PAL_wcsncmp(
        const char16_t *string1,
        const char16_t *string2,
        size_t count)
{
    size_t i;
    int diff = 0;

    PERF_ENTRY(wcsncmp);
    ENTRY("wcsncmp (string1=%p (%S), string2=%p (%S) count=%lu)\n",
          string1?string1:W16_NULLSTRING,
          string1?string1:W16_NULLSTRING, string2?string2:W16_NULLSTRING, string2?string2:W16_NULLSTRING,
          (unsigned long) count);

    if (string1 == string2) return diff;

    for (i = 0; i < count; i++)
    {
        diff = string1[i] - string2[i];
        if (diff != 0)
        {
            break;
        }

        /* stop if we reach the end of the string */
        if(string1[i]==0)
        {
            break;
        }
    }
    LOGEXIT("wcsncmp returning int %d\n", diff);
    PERF_EXIT(wcsncmp);
    return diff;
}